

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsStamp.cpp
# Opt level: O2

void __thiscall OpenMD::ZConsStamp::validate(ZConsStamp *this)

{
  int iVar1;
  pointer pcVar2;
  string local_60 [32];
  undefined8 local_40 [4];
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->MolIndex).super_ParameterBase.empty_ == false) {
    isNonNegative();
    iVar1 = *(int *)&(this->MolIndex).super_ParameterBase.field_0x2c;
    std::__cxx11::string::~string((string *)local_40);
    if (iVar1 < 0) {
      pcVar2 = (this->MolIndex).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)local_40,local_60);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_40[0]);
      std::__cxx11::string::~string((string *)local_40);
      std::__cxx11::string::~string(local_60);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void ZConsStamp::validate() {
    DataHolder::validate();
    CheckParameter(MolIndex, isNonNegative());
  }